

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
     VerifyBlockConsistencyInList
               (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *heapBlock,
               RecyclerVerifyListConsistencyData *recyclerSweep)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  GenericRecyclerVerifyListConsistencyData<MediumAllocationBlockAttributes> *pGVar5;
  bool *pbVar6;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this;
  undefined4 *puVar7;
  bool local_31;
  HeapBlock *nextAllocableBlockHead;
  bool *expectDispose;
  bool *expectFull;
  RecyclerVerifyListConsistencyData *recyclerSweep_local;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_local;
  
  pGVar5 = &recyclerSweep->mediumBlockVerifyListConsistencyData;
  pbVar6 = &(recyclerSweep->mediumBlockVerifyListConsistencyData).expectDispose;
  pSVar1 = (recyclerSweep->mediumBlockVerifyListConsistencyData).nextAllocableBlockHead;
  if (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes> == pSVar1) {
    pGVar5->expectFull = false;
  }
  bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsClearedFromAllocator
                    (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
  if (bVar3) {
    if (((pGVar5->expectFull & 1U) == 0) || ((*pbVar6 & 1U) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3bb,"(*expectFull && !*expectDispose)","*expectFull && !*expectDispose")
      ;
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::HasFreeObject
                      (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3bc,"(heapBlock->HasFreeObject())","heapBlock->HasFreeObject()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::HasAnyDisposeObjects
                      (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
    if (!bVar3) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x3bd,"(!heapBlock->HasAnyDisposeObjects())",
                       "!heapBlock->HasAnyDisposeObjects()");
    if (bVar3) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      return;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if ((*pbVar6 & 1U) == 0) {
    bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::HasAnyDisposeObjects
                      (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3c7,"(!heapBlock->HasAnyDisposeObjects())",
                         "!heapBlock->HasAnyDisposeObjects()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar3 = pGVar5->expectFull;
    bVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::HasFreeObject
                      (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
    local_31 = true;
    if (bVar4) {
      local_31 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsInAllocator
                           (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
    }
    if ((bool)(bVar3 & 1U) == local_31) {
      return;
    }
    if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x3d3,
                       "(*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr)"
                       ,
                       "*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr"
                      );
    if (bVar3) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      return;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  bVar3 = HeapBlock::IsAnyFinalizableBlock((HeapBlock *)heapBlock);
  if (bVar3) {
    this = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>((HeapBlock *)heapBlock);
    bVar3 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::IsPendingDispose(this);
    if (bVar3) goto LAB_00928831;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                     ,0x3c2,
                     "(heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose())"
                     ,
                     "heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose()"
                    );
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 0;
LAB_00928831:
  bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::HasAnyDisposeObjects
                    (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x3c3,"(heapBlock->HasAnyDisposeObjects())",
                       "heapBlock->HasAnyDisposeObjects()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::VerifyBlockConsistencyInList(TBlockType * heapBlock, RecyclerVerifyListConsistencyData& recyclerSweep)
{
    bool* expectFull = nullptr;
    bool* expectDispose = nullptr;
    HeapBlock* nextAllocableBlockHead = nullptr;

    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        expectFull = &recyclerSweep.smallBlockVerifyListConsistencyData.expectFull;
        expectDispose = &recyclerSweep.smallBlockVerifyListConsistencyData.expectDispose;
        nextAllocableBlockHead = recyclerSweep.smallBlockVerifyListConsistencyData.nextAllocableBlockHead;
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        expectFull = &recyclerSweep.mediumBlockVerifyListConsistencyData.expectFull;
        expectDispose = &recyclerSweep.mediumBlockVerifyListConsistencyData.expectDispose;
        nextAllocableBlockHead = recyclerSweep.mediumBlockVerifyListConsistencyData.nextAllocableBlockHead;
    }
    else
    {
        Assert(false);
    }

    if (heapBlock == nextAllocableBlockHead)
    {
        (*expectFull) = false;
    }
    if (heapBlock->IsClearedFromAllocator())
    {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        // As the blocks are added to a SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
        // We could do some work to make this work again but there may be perf hit and it may be fragile.
        if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
        {
            Assert(*expectFull && !*expectDispose);
            Assert(heapBlock->HasFreeObject());
            Assert(!heapBlock->HasAnyDisposeObjects());
        }
    }
    else if (*expectDispose)
    {
        Assert(heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose());
        Assert(heapBlock->HasAnyDisposeObjects());
    }
    else
    {
        Assert(!heapBlock->HasAnyDisposeObjects());

        // ExpectFull is a bit of a misnomer if the list in question is the heap block list. It's there to check
        // of the heap block in question is before the nextAllocableBlockHead or not. This is to ensure that
        // blocks before nextAllocableBlockHead that are not being bump allocated from must be considered "full".
        // However, the exception is if this is the only heap block in this bucket, in which case nextAllocableBlockHead
        // would be null
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        // As the blocks are added to the SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
        if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
        {
            Assert(*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr);
        }
    }
}